

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

void __thiscall
pbrt::Cylinder::Cylinder
          (Cylinder *this,Transform *renderFromObject,Transform *objectFromRender,
          bool reverseOrientation,Float radius,Float zMin,Float zMax,Float phiMax)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  undefined1 auVar7 [16];
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined4 in_XMM2_Db;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  undefined4 in_XMM3_Db;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  
  this->renderFromObject = renderFromObject;
  this->objectFromRender = objectFromRender;
  this->reverseOrientation = reverseOrientation;
  bVar6 = Transform::SwapsHandedness(renderFromObject);
  auVar4._4_4_ = in_XMM1_Db;
  auVar4._0_4_ = zMin;
  auVar4._8_4_ = in_XMM1_Dc;
  auVar4._12_4_ = in_XMM1_Dd;
  auVar2._4_4_ = in_XMM2_Db;
  auVar2._0_4_ = zMax;
  auVar2._8_4_ = in_XMM2_Dc;
  auVar2._12_4_ = in_XMM2_Dd;
  auVar5._4_4_ = in_XMM3_Db;
  auVar5._0_4_ = phiMax;
  auVar5._8_4_ = in_XMM3_Dc;
  auVar5._12_4_ = in_XMM3_Dd;
  this->transformSwapsHandedness = bVar6;
  this->radius = radius;
  auVar2 = vminss_avx(auVar2,auVar4);
  this->zMin = auVar2._0_4_;
  auVar2 = vinsertps_avx(auVar4,auVar5,0x10);
  uVar3 = vcmpps_avx512vl(auVar2,ZEXT416((uint)zMax),1);
  auVar2 = vminss_avx(SUB6416(ZEXT464(0x43b40000),0),auVar5);
  auVar2 = vinsertps_avx(auVar4,ZEXT416((uint)(auVar2._0_4_ * 0.017453292)),0x10);
  bVar6 = (bool)((byte)uVar3 & 1);
  auVar7._0_4_ = (uint)bVar6 * (int)zMax | (uint)!bVar6 * auVar2._0_4_;
  auVar7._4_4_ = (uint)!(bool)((byte)(uVar3 >> 1) & 1) * auVar2._4_4_;
  auVar7._8_4_ = (uint)!(bool)((byte)(uVar3 >> 2) & 1) * auVar2._8_4_;
  auVar7._12_4_ = (uint)!(bool)((byte)(uVar3 >> 3) & 1) * auVar2._12_4_;
  uVar1 = vmovlps_avx(auVar7);
  this->zMax = (Float)(int)uVar1;
  this->phiMax = (Float)(int)((ulong)uVar1 >> 0x20);
  return;
}

Assistant:

inline Cylinder::Cylinder(const Transform *renderFromObject,
                          const Transform *objectFromRender, bool reverseOrientation,
                          Float radius, Float zMin, Float zMax, Float phiMax)
    : renderFromObject(renderFromObject),
      objectFromRender(objectFromRender),
      reverseOrientation(reverseOrientation),
      transformSwapsHandedness(renderFromObject->SwapsHandedness()),
      radius(radius),
      zMin(std::min(zMin, zMax)),
      zMax(std::max(zMin, zMax)),
      phiMax(Radians(Clamp(phiMax, 0, 360))) {}